

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

void Bac_ManRemapBarbufs(Bac_Man_t *pNew,Bac_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Bac_Ntk_t *pBVar4;
  long lVar5;
  
  if ((pNew->vBuf2RootNtk).nSize != 0) {
    __assert_fail("!Vec_IntSize(&pNew->vBuf2RootNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x131,"void Bac_ManRemapBarbufs(Bac_Man_t *, Bac_Man_t *)");
  }
  if (0 < (p->vBuf2RootNtk).nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(&pNew->vBuf2RootNtk,(p->vBuf2RootNtk).pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vBuf2RootNtk).nSize);
  }
  if (0 < (p->vBuf2RootObj).nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(&pNew->vBuf2RootObj,(p->vBuf2RootObj).pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vBuf2RootObj).nSize);
  }
  if (0 < (p->vBuf2LeafNtk).nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(&pNew->vBuf2LeafNtk,(p->vBuf2LeafNtk).pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vBuf2LeafNtk).nSize);
  }
  if (0 < (p->vBuf2LeafObj).nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(&pNew->vBuf2LeafObj,(p->vBuf2LeafObj).pArray[lVar5]);
      lVar5 = lVar5 + 1;
      iVar1 = (p->vBuf2LeafObj).nSize;
    } while (lVar5 < iVar1);
    if (0 < iVar1) {
      piVar3 = (p->vBuf2LeafObj).pArray;
      lVar5 = 0;
      do {
        if ((p->vBuf2LeafNtk).nSize <= lVar5) goto LAB_008bd3be;
        iVar1 = (p->vBuf2LeafNtk).pArray[lVar5];
        if (((long)iVar1 < 1) || (p->nNtks < iVar1)) {
          pBVar4 = (Bac_Ntk_t *)0x0;
        }
        else {
          pBVar4 = p->pNtks + iVar1;
        }
        uVar2 = piVar3[lVar5];
        if (((int)uVar2 < 0) || ((pBVar4->vCopy).nSize <= (int)uVar2)) goto LAB_008bd3be;
        if ((pNew->vBuf2LeafObj).nSize <= lVar5) goto LAB_008bd3dd;
        (pNew->vBuf2LeafObj).pArray[lVar5] = (pBVar4->vCopy).pArray[uVar2];
        lVar5 = lVar5 + 1;
      } while (lVar5 < (p->vBuf2LeafObj).nSize);
    }
  }
  if (0 < (p->vBuf2RootObj).nSize) {
    piVar3 = (p->vBuf2RootObj).pArray;
    lVar5 = 0;
    do {
      if ((p->vBuf2RootNtk).nSize <= lVar5) {
LAB_008bd3be:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = (p->vBuf2RootNtk).pArray[lVar5];
      if (((long)iVar1 < 1) || (p->nNtks < iVar1)) {
        pBVar4 = (Bac_Ntk_t *)0x0;
      }
      else {
        pBVar4 = p->pNtks + iVar1;
      }
      uVar2 = piVar3[lVar5];
      if (((int)uVar2 < 0) || ((pBVar4->vCopy).nSize <= (int)uVar2)) goto LAB_008bd3be;
      if ((pNew->vBuf2RootObj).nSize <= lVar5) {
LAB_008bd3dd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pNew->vBuf2RootObj).pArray[lVar5] = (pBVar4->vCopy).pArray[uVar2];
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vBuf2RootObj).nSize);
  }
  return;
}

Assistant:

void Bac_ManRemapBarbufs( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk;  int Entry, i;
    //assert( Vec_IntSize(&p->vBuf2RootNtk) );
    assert( !Vec_IntSize(&pNew->vBuf2RootNtk) );
    Vec_IntAppend( &pNew->vBuf2RootNtk, &p->vBuf2RootNtk );
    Vec_IntAppend( &pNew->vBuf2RootObj, &p->vBuf2RootObj );
    Vec_IntAppend( &pNew->vBuf2LeafNtk, &p->vBuf2LeafNtk );
    Vec_IntAppend( &pNew->vBuf2LeafObj, &p->vBuf2LeafObj );
    Vec_IntForEachEntry( &p->vBuf2LeafObj, Entry, i )
    {
        pNtk = Bac_ManNtk( p, Vec_IntEntry(&p->vBuf2LeafNtk, i) );
        Vec_IntWriteEntry( &pNew->vBuf2LeafObj, i, Bac_ObjCopy(pNtk, Entry) );
    }
    Vec_IntForEachEntry( &p->vBuf2RootObj, Entry, i )
    {
        pNtk = Bac_ManNtk( p, Vec_IntEntry(&p->vBuf2RootNtk, i) );
        Vec_IntWriteEntry( &pNew->vBuf2RootObj, i, Bac_ObjCopy(pNtk, Entry) );
    }
}